

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FillPatchUtil_I.H
# Opt level: O2

enable_if_t<IsFabArray<MultiFab>::value>
amrex::
InterpFromCoarseLevel<amrex::MultiFab,amrex::PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>>,amrex::InterpBase,amrex::NullInterpHook<amrex::FArrayBox>,amrex::NullInterpHook<amrex::FArrayBox>>
          (MultiFab *mf,IntVect *nghost,Real time,MultiFab *cmf,int scomp,int dcomp,int ncomp,
          Geometry *cgeom,Geometry *fgeom,
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *cbc,
          int cbccomp,
          PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_> *fbc,
          int fbccomp,IntVect *ratio,InterpBase *mapper,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcscomp,
          NullInterpHook<amrex::FArrayBox> *pre_interp,NullInterpHook<amrex::FArrayBox> *post_interp
          )

{
  BoxArray *this;
  int *piVar1;
  element_type *peVar2;
  undefined8 uVar3;
  DistributionMapping *dm;
  int i;
  IndexType IVar4;
  IndexType IVar5;
  uint uVar6;
  IndexSpace *pIVar7;
  long lVar8;
  uint uVar9;
  IndexType IVar10;
  int iVar11;
  undefined4 uVar12;
  int iVar13;
  FabArrayBase *fabarray_;
  ulong uVar14;
  Periodicity PVar15;
  initializer_list<int> __l;
  allocator_type local_329;
  int local_328;
  int local_324;
  IntVect *local_320;
  Box bx;
  FabFactory<amrex::FArrayBox> *local_2f0;
  int local_2e4;
  DistributionMapping *local_2e0;
  FabArrayBase *local_2d8;
  Real local_2d0;
  Box result;
  int local_2a0;
  Box local_258;
  InterpolaterBoxCoarsener local_238;
  MultiFab mf_crse_patch;
  BoxArray ba_crse_patch;
  
  local_328 = dcomp;
  local_320 = nghost;
  local_2e4 = scomp;
  local_2d0 = time;
  InterpBase::BoxCoarsener(mapper,ratio);
  this = &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  IVar4 = BATransformer::index_type(&this->m_bat);
  IVar5 = BATransformer::index_type(&this->m_bat);
  uVar3 = *(undefined8 *)(fgeom->domain).bigend.vect;
  bx.smallend.vect._0_8_ = *(undefined8 *)(fgeom->domain).smallend.vect;
  bx.smallend.vect[2] = (int)*(undefined8 *)((fgeom->domain).smallend.vect + 2);
  bx.bigend.vect[0] = (int)uVar3;
  bx.bigend.vect[1] = (int)((ulong)uVar3 >> 0x20);
  bx._20_8_ = *(undefined8 *)((fgeom->domain).bigend.vect + 2);
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    uVar9 = 1 << ((byte)lVar8 & 0x1f);
    uVar6 = (uint)lVar8;
    bx.bigend.vect[lVar8] =
         (bx.bigend.vect[lVar8] + (uint)((IVar5.itype >> (uVar6 & 0x1f) & 1) != 0)) -
         (uint)((bx.btype.itype >> (uVar6 & 0x1f) & 1) != 0);
    if ((IVar5.itype >> (uVar6 & 0x1f) & 1) == 0) {
      IVar10.itype = ~uVar9 & bx.btype.itype;
    }
    else {
      IVar10.itype = uVar9 | bx.btype.itype;
    }
    bx.btype.itype = IVar10.itype;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    if (*(char *)((long)(fgeom->super_CoordSys).inv_dx + lVar8 + 0x19) == '\x01') {
      iVar11 = local_320->vect[lVar8];
      piVar1 = bx.smallend.vect + lVar8;
      *piVar1 = *piVar1 - iVar11;
      piVar1 = bx.bigend.vect + lVar8;
      *piVar1 = *piVar1 + iVar11;
    }
  }
  peVar2 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_324 = ncomp;
  BoxArray::BoxArray(&ba_crse_patch,
                     ((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     *(long *)&(peVar2->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data) / 0x1c);
  local_2e0 = &(mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  peVar2 = (mf->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray.m_ref.
           super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar13 = 0;
  iVar11 = (int)(((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data) / 0x1c);
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  local_2d8 = (FabArrayBase *)mf;
  for (; iVar13 != iVar11; iVar13 = iVar13 + 1) {
    BoxArray::operator[](&local_258,this,iVar13);
    result.bigend.vect[1] = local_258.bigend.vect[1];
    result.bigend.vect[2] = local_258.bigend.vect[2];
    result.btype.itype = local_258.btype.itype;
    result.smallend.vect[0]._0_1_ = (undefined1)local_258.smallend.vect[0];
    result.smallend.vect._1_7_ = local_258.smallend.vect._1_7_;
    result.smallend.vect[2] = local_258.smallend.vect[2];
    result.bigend.vect[0] = local_258.bigend.vect[0];
    Box::grow(&result,local_320);
    mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
    m_indexType.m_typ.itype = (BATindexType)(BATindexType)result.bigend.vect[0];
    mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
    .m_typ.itype = (IndexType)(IndexType)result.bigend.vect[1];
    mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._8_8_ =
         CONCAT44(result.btype.itype,result.bigend.vect[2]);
    for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
      uVar6 = 1 << ((byte)lVar8 & 0x1f);
      uVar9 = (uint)lVar8;
      *(uint *)((long)&mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                       m_bat.m_op + lVar8 * 4) =
           (*(int *)((long)&mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                            boxarray.m_bat.m_op + lVar8 * 4) +
           (uint)((IVar4.itype >> (uVar9 & 0x1f) & 1) != 0)) -
           (uint)(((uint)mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                         m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1] >> (uVar9 & 0x1f) & 1) != 0);
      if ((IVar4.itype >> (uVar9 & 0x1f) & 1) == 0) {
        uVar6 = ~uVar6 & mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                         m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
      }
      else {
        uVar6 = uVar6 | mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                        m_bat.m_op.m_bndryReg.m_crse_ratio.vect[1];
      }
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
      m_bndryReg.m_crse_ratio.vect[1] = uVar6;
    }
    uVar14 = CONCAT44(-(uint)(bx.smallend.vect[1] < result.smallend.vect[1]),
                      -(uint)(bx.smallend.vect[0] <
                             (int)CONCAT71(result.smallend.vect._1_7_,
                                           (undefined1)result.smallend.vect[0])));
    mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
         (_func_int **)
         (~uVar14 & bx.smallend.vect._0_8_ |
         CONCAT71(result.smallend.vect._1_7_,(undefined1)result.smallend.vect[0]) & uVar14);
    mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
         bx.smallend.vect[2];
    if (bx.smallend.vect[2] < result.smallend.vect[2]) {
      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
           result.smallend.vect[2];
    }
    uVar14 = CONCAT44(-(uint)((int)mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase
                                   .boxarray.m_bat.m_op.m_bndryReg.m_typ.itype < bx.bigend.vect[1]),
                      -(uint)((int)mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase
                                   .boxarray.m_bat.m_op.m_indexType.m_typ.itype < bx.bigend.vect[0])
                     );
    uVar14 = ~uVar14 & CONCAT44(bx.bigend.vect[1],bx.bigend.vect[0]) |
             CONCAT44(mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                      m_bat.m_op.m_bndryReg.m_typ.itype,
                      mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                      m_bat.m_op.m_indexType.m_typ.itype) & uVar14;
    mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
    m_indexType.m_typ.itype = SUB84(uVar14,0);
    mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
    .m_typ.itype = SUB84(uVar14 >> 0x20,0);
    uVar12 = bx.bigend.vect[2];
    if (mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
        m_bndryReg.m_crse_ratio.vect[0] < bx.bigend.vect[2]) {
      uVar12 = mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op
               .m_bndryReg.m_crse_ratio.vect[0];
    }
    mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg
    .m_crse_ratio.vect[0] = uVar12;
    InterpolaterBoxCoarsener::doit(&result,&local_238,(Box *)&mf_crse_patch);
    BoxArray::set(&ba_crse_patch,iVar13,&result);
  }
  MultiFab::MultiFab(&mf_crse_patch);
  pIVar7 = EB2::TopIndexSpaceIfPresent();
  iVar11 = local_324;
  if (pIVar7 == (IndexSpace *)0x0) {
    result.smallend.vect._1_7_ = 0;
    result.smallend.vect[0]._0_1_ = 1;
    result.smallend.vect[2] = 0;
    result.bigend.vect[0] = 0;
    result.bigend.vect[1] = 0;
    result.bigend.vect[2] = 0;
    result.btype.itype = 0;
    local_258.smallend.vect._0_8_ = &PTR__FabFactory_007d2928;
    MultiFab::define(&mf_crse_patch,&ba_crse_patch,local_2e0,local_324,0,(MFInfo *)&result,
                     (FabFactory<amrex::FArrayBox> *)&local_258);
    fabarray_ = local_2d8;
    iVar13 = local_328;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(result.bigend.vect + 1));
  }
  else {
    local_258.smallend.vect._0_8_ = (_func_int **)0x0;
    local_258.smallend.vect[2] = 0;
    __l._M_len = 3;
    __l._M_array = (iterator)&local_258;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&result,__l,&local_329);
    fabarray_ = local_2d8;
    dm = local_2e0;
    iVar11 = local_324;
    iVar13 = local_328;
    makeEBFabFactory((Geometry *)&local_2f0,(BoxArray *)cgeom,(DistributionMapping *)&ba_crse_patch,
                     (Vector<int,_std::allocator<int>_> *)local_2e0,(EBSupport)&result);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&result);
    result.smallend.vect._1_7_ = 0;
    result.smallend.vect[0]._0_1_ = 1;
    result.smallend.vect[2] = 0;
    result.bigend.vect[0] = 0;
    result.bigend.vect[1] = 0;
    result.bigend.vect[2] = 0;
    result.btype.itype = 0;
    MultiFab::define(&mf_crse_patch,&ba_crse_patch,dm,iVar11,0,(MFInfo *)&result,local_2f0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(result.bigend.vect + 1));
    if (local_2f0 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*local_2f0->_vptr_FabFactory[1])();
    }
  }
  FabArray<amrex::FArrayBox>::setDomainBndry<amrex::FArrayBox,_0>
            (&mf_crse_patch.super_FabArray<amrex::FArrayBox>,NAN,cgeom);
  PVar15 = Geometry::periodicity(cgeom);
  result.smallend.vect[0]._0_1_ = (undefined1)PVar15.period.vect[0];
  result.smallend.vect._1_7_ = PVar15.period.vect._1_7_;
  result.smallend.vect[2] = PVar15.period.vect[2];
  FabArray<amrex::FArrayBox>::ParallelCopy
            (&mf_crse_patch.super_FabArray<amrex::FArrayBox>,&cmf->super_FabArray<amrex::FArrayBox>,
             local_2e4,0,iVar11,(Periodicity *)&result,COPY);
  result.smallend.vect[0]._0_1_ =
       (undefined1)mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[0];
  result.smallend.vect._1_7_ =
       mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect._1_7_;
  result.smallend.vect[2] =
       mf_crse_patch.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow.vect[2];
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::operator()
            (cbc,&mf_crse_patch,0,iVar11,&result.smallend,local_2d0,cbccomp);
  MFIter::MFIter((MFIter *)&result,(FabArrayBase *)&mf_crse_patch,'\0');
  while (0 < local_2a0) {
    MFIter::operator++((MFIter *)&result);
  }
  MFIter::~MFIter((MFIter *)&result);
  FillPatchInterp<amrex::MultiFab>
            ((MultiFab *)fabarray_,iVar13,&mf_crse_patch,0,iVar11,local_320,cgeom,fgeom,&bx,ratio,
             mapper,bcs,bcscomp);
  MFIter::MFIter((MFIter *)&result,fabarray_,'\0');
  while (0 < local_2a0) {
    MFIter::operator++((MFIter *)&result);
  }
  MFIter::~MFIter((MFIter *)&result);
  PhysBCFunct<amrex::GpuBndryFuncFab<pele::physics::pltfilemanager::FillExtDirDummy>_>::operator()
            (fbc,(MultiFab *)fabarray_,iVar13,iVar11,local_320,local_2d0,fbccomp);
  MultiFab::~MultiFab(&mf_crse_patch);
  BoxArray::~BoxArray(&ba_crse_patch);
  InterpolaterBoxCoarsener::~InterpolaterBoxCoarsener(&local_238);
  return;
}

Assistant:

std::enable_if_t<IsFabArray<MF>::value>
InterpFromCoarseLevel (MF& mf, IntVect const& nghost, Real time,
                       const MF& cmf, int scomp, int dcomp, int ncomp,
                       const Geometry& cgeom, const Geometry& fgeom,
                       BC& cbc, int cbccomp,
                       BC& fbc, int fbccomp,
                       const IntVect& ratio,
                       Interp* mapper,
                       const Vector<BCRec>& bcs, int bcscomp,
                       const PreInterpHook& pre_interp,
                       const PostInterpHook& post_interp)
{
    using FAB = typename MF::FABType::value_type;

    const InterpolaterBoxCoarsener& coarsener = mapper->BoxCoarsener(ratio);

    const BoxArray& ba = mf.boxArray();
    const DistributionMapping& dm = mf.DistributionMap();

    const IndexType& typ = ba.ixType();

    BL_ASSERT(typ == cmf.boxArray().ixType());

    Box fdomain_g( amrex::convert(fgeom.Domain(),mf.ixType()) );
    for (int i = 0; i < AMREX_SPACEDIM; ++i) {
        if (fgeom.isPeriodic(i)) {
            fdomain_g.grow(i,nghost[i]);
        }
    }

    BoxArray ba_crse_patch(ba.size());
    {  // TODO: later we might want to cache this
        for (int i = 0, N = ba.size(); i < N; ++i)
        {
            Box bx = amrex::convert(amrex::grow(ba[i],nghost), typ);
            bx &= fdomain_g;
            ba_crse_patch.set(i, coarsener.doit(bx));
        }
    }

    MF mf_crse_patch;
#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        auto factory = makeEBFabFactory(cgeom, ba_crse_patch, dm, {0,0,0}, EBSupport::basic);
        mf_crse_patch.define(ba_crse_patch, dm, ncomp, 0, MFInfo(), *factory);
    } else
#endif
    {
        mf_crse_patch.define(ba_crse_patch, dm, ncomp, 0);
    }
    mf_set_domain_bndry (mf_crse_patch, cgeom);

    mf_crse_patch.ParallelCopy(cmf, scomp, 0, ncomp, cgeom.periodicity());

    cbc(mf_crse_patch, 0, ncomp, mf_crse_patch.nGrowVect(), time, cbccomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf_crse_patch); mfi.isValid(); ++mfi)
    {
        FAB& sfab   = mf_crse_patch[mfi];
        pre_interp(sfab, sfab.box(), 0, ncomp);
    }

    FillPatchInterp(mf, dcomp, mf_crse_patch, 0, ncomp, nghost, cgeom, fgeom, fdomain_g,
                    ratio, mapper, bcs, bcscomp);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(mf); mfi.isValid(); ++mfi)
    {
        FAB& dfab   = mf[mfi];
        Box dfab_bx = dfab.box();
        dfab_bx.grow(nghost-mf.nGrowVect());
        const Box& dbx = dfab_bx & fdomain_g;

        post_interp(dfab, dbx, dcomp, ncomp);
    }

    fbc(mf, dcomp, ncomp, nghost, time, fbccomp);
}